

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::TimeScaleFunc::~TimeScaleFunc(TimeScaleFunc *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~TimeScaleFunc((TimeScaleFunc *)0xb25608);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

TimeScaleFunc(KnownSystemName knownNameId, bool isOptional) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isOptional(isOptional) {}